

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O1

bool P_CheckKeys(AActor *owner,int keynum,bool remote)

{
  Lock *pLVar1;
  bool bVar2;
  AActor *pAVar3;
  char *msg;
  uint uVar4;
  ulong uVar5;
  FSoundID *pFVar6;
  FSoundID failage [2];
  FSoundID local_40;
  FSoundID local_3c;
  int local_38;
  FSoundID local_34;
  
  if (owner == (AActor *)0x0) {
    return false;
  }
  bVar2 = true;
  if (0xffffff00 < keynum - 0x100U) {
    if (keysdone == '\0') {
      P_InitKeyMessages();
    }
    local_3c.ID = S_FindSound("*keytry");
    local_38 = S_FindSound("misc/keytry");
    if (locks[(uint)keynum] == (Lock *)0x0) {
      pFVar6 = &local_3c;
      if ((keynum == 0x67) && (((byte)gameinfo.flags & 2) != 0)) {
        uVar4 = 2;
        msg = "$TXT_RETAIL_ONLY";
      }
      else {
        uVar4 = 2;
        msg = "$TXT_DOES_NOT_WORK";
      }
    }
    else {
      bVar2 = Lock::check(locks[(uint)keynum],owner);
      if (bVar2) {
        return true;
      }
      pLVar1 = locks[(uint)keynum];
      msg = (&pLVar1->Message)[remote].Chars;
      pFVar6 = (pLVar1->locksound).Array;
      uVar4 = (pLVar1->locksound).Count;
    }
    pAVar3 = (AActor *)(&DAT_00a39408)[(long)consoleplayer * 0x54];
    if ((pAVar3 != (AActor *)0x0) &&
       (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (&DAT_00a39408)[(long)consoleplayer * 0x54] = 0;
      pAVar3 = (AActor *)0x0;
    }
    if (pAVar3 == owner) {
      if (msg != (char *)0x0) {
        if (*msg == '$') {
          msg = FStringTable::operator()(&GStrings,msg + 1);
        }
        C_MidPrint(SmallFont,msg);
      }
      if (0 < (int)uVar4) {
        uVar5 = 0;
        do {
          local_40.ID = pFVar6[uVar5].ID;
          if ((local_40.ID != 0) &&
             (local_34.ID = S_FindSkinnedSound(owner,&local_40), local_34.ID != 0)) {
            S_Sound(owner,2,&local_34,1.0,1.0);
            break;
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool P_CheckKeys (AActor *owner, int keynum, bool remote)
{
	const char *failtext = NULL;
	FSoundID *failsound;
	int numfailsounds;

	if (owner == NULL) return false;
	if (keynum<=0 || keynum>255) return true;
	// Just a safety precaution. The messages should have been initialized upon game start.
	if (!keysdone) P_InitKeyMessages();

	FSoundID failage[2] = { "*keytry", "misc/keytry" };

	if (!locks[keynum]) 
	{
		if (keynum == 103 && (gameinfo.flags & GI_SHAREWARE))
			failtext = "$TXT_RETAIL_ONLY";
		else
			failtext = "$TXT_DOES_NOT_WORK";

		failsound = failage;
		numfailsounds = countof(failage);
	}
	else
	{
		if (locks[keynum]->check(owner)) return true;
		failtext = remote? locks[keynum]->RemoteMsg : locks[keynum]->Message;
		failsound = &locks[keynum]->locksound[0];
		numfailsounds = locks[keynum]->locksound.Size();
	}

	// If we get here, that means the actor isn't holding an appropriate key.

	if (owner == players[consoleplayer].camera)
	{
		PrintMessage(failtext);

		// Play the first defined key sound.
		for (int i = 0; i < numfailsounds; ++i)
		{
			if (failsound[i] != 0)
			{
				int snd = S_FindSkinnedSound(owner, failsound[i]);
				if (snd != 0)
				{
					S_Sound (owner, CHAN_VOICE, snd, 1, ATTN_NORM);
					break;
				}
			}
		}
	}

	return false;
}